

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

iter_type __thiscall
booster::locale::impl_icu::num_parse<char>::do_real_get<long_double>
          (num_parse<char> *this,iter_type in,iter_type end,ios_base *ios,iostate *err,
          longdouble *val)

{
  longdouble lVar1;
  bool bVar2;
  char_type cVar3;
  int iVar4;
  pointer pfVar5;
  ulong uVar6;
  undefined4 extraout_var;
  undefined8 in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  num_parse<char> *in_RDI;
  undefined4 in_R8D;
  long in_R9;
  bool bVar7;
  istreambuf_iterator<char,_std::char_traits<char>_> iVar8;
  iter_type iVar9;
  undefined4 in_stack_00000008;
  longdouble *in_stack_00000010;
  size_t n;
  size_t parsed_chars;
  cast_type value;
  char c;
  string_type tmp;
  stream_type *stream_ptr;
  formatter_ptr formatter;
  undefined4 in_stack_fffffffffffffe58;
  _Ios_Iostate in_stack_fffffffffffffe5c;
  undefined2 in_stack_fffffffffffffe60;
  undefined2 in_stack_fffffffffffffe62;
  int in_stack_fffffffffffffe64;
  undefined7 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6f;
  istreambuf_iterator<char,_std::char_traits<char>_> *in_stack_fffffffffffffe70;
  undefined2 in_stack_fffffffffffffe78;
  ios_base *in_stack_fffffffffffffe88;
  istreambuf_iterator<char,_std::char_traits<char>_> *local_138;
  undefined8 local_120;
  undefined4 local_118;
  ulong local_110;
  double local_100;
  streambuf_type *local_f8;
  int_type local_f0;
  streambuf_type *local_e8;
  int_type local_e0;
  char_type local_d1;
  string local_d0 [36];
  undefined4 local_ac;
  undefined1 local_a8 [12];
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined8 local_88;
  byte local_69;
  istreambuf_iterator<char,_std::char_traits<char>_> *local_50;
  long local_40;
  undefined8 local_30;
  undefined4 uStack_28;
  undefined4 uStack_24;
  undefined8 local_20;
  undefined4 uStack_18;
  undefined1 local_10 [12];
  
  local_40 = in_R9;
  local_30 = in_RCX;
  uStack_28 = in_R8D;
  local_20 = in_RSI;
  uStack_18 = in_EDX;
  std::
  unique_ptr<booster::locale::impl_icu::formatter<char>,std::default_delete<booster::locale::impl_icu::formatter<char>>>
  ::unique_ptr<std::default_delete<booster::locale::impl_icu::formatter<char>>,void>
            ((unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
              *)CONCAT44(in_stack_fffffffffffffe64,
                         CONCAT22(in_stack_fffffffffffffe62,in_stack_fffffffffffffe60)));
  if (local_40 == 0) {
    local_138 = (istreambuf_iterator<char,_std::char_traits<char>_> *)0x0;
  }
  else {
    local_138 = (istreambuf_iterator<char,_std::char_traits<char>_> *)
                __dynamic_cast(local_40,&std::ios_base::typeinfo,&std::istream::typeinfo,
                               0xffffffffffffffff);
  }
  local_50 = local_138;
  local_69 = 0;
  bVar7 = true;
  if (local_138 != (istreambuf_iterator<char,_std::char_traits<char>_> *)0x0) {
    lVar1 = (longdouble)0;
    in_stack_fffffffffffffe58 = SUB104(lVar1,0);
    in_stack_fffffffffffffe5c = (_Ios_Iostate)((unkuint10)lVar1 >> 0x20);
    in_stack_fffffffffffffe60 = (undefined2)((unkuint10)lVar1 >> 0x40);
    bVar2 = num_base::use_parent<long_double>
                      (in_stack_fffffffffffffe88,
                       (longdouble)CONCAT28(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70));
    bVar7 = true;
    if (!bVar2) {
      formatter<char>::create
                ((ios_base *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
                 (Locale *)
                 CONCAT44(in_stack_fffffffffffffe64,
                          CONCAT22(in_stack_fffffffffffffe62,in_stack_fffffffffffffe60)),
                 (string *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      local_69 = 1;
      std::
      unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
      ::operator=((unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
                   *)CONCAT44(in_stack_fffffffffffffe64,
                              CONCAT22(in_stack_fffffffffffffe62,in_stack_fffffffffffffe60)),
                  (unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
                   *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      pfVar5 = std::
               unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
               ::get((unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
                      *)CONCAT44(in_stack_fffffffffffffe64,
                                 CONCAT22(in_stack_fffffffffffffe62,in_stack_fffffffffffffe60)));
      bVar7 = pfVar5 == (pointer)0x0;
    }
  }
  if ((local_69 & 1) != 0) {
    std::
    unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
    ::~unique_ptr((unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
                   *)CONCAT44(in_stack_fffffffffffffe64,
                              CONCAT22(in_stack_fffffffffffffe62,in_stack_fffffffffffffe60)));
  }
  if (bVar7) {
    local_88 = local_20;
    local_98 = (undefined4)local_30;
    uStack_94 = local_30._4_4_;
    uStack_90 = uStack_28;
    uStack_8c = uStack_24;
    in_stack_fffffffffffffe60 = SUB82(in_stack_00000010,0);
    in_stack_fffffffffffffe62 = (undefined2)((ulong)in_stack_00000010 >> 0x10);
    in_stack_fffffffffffffe64 = (int)((ulong)in_stack_00000010 >> 0x20);
    local_a8 = std::num_get<char,std::istreambuf_iterator<char,std::char_traits<char>>>::do_get
                         (in_RDI,local_20,uStack_18,local_30,uStack_28,local_40,in_stack_00000008);
    local_ac = 1;
    local_10 = local_a8;
  }
  else {
    std::__cxx11::string::string(local_d0);
    std::__cxx11::string::reserve((ulong)local_d0);
    while( true ) {
      bVar2 = std::operator!=((istreambuf_iterator<char,_std::char_traits<char>_> *)
                              CONCAT44(in_stack_fffffffffffffe64,
                                       CONCAT22(in_stack_fffffffffffffe62,in_stack_fffffffffffffe60)
                                      ),
                              (istreambuf_iterator<char,_std::char_traits<char>_> *)
                              CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      bVar7 = false;
      if ((bVar2) &&
         ((local_d1 = std::istreambuf_iterator<char,_std::char_traits<char>_>::operator*
                                ((istreambuf_iterator<char,_std::char_traits<char>_> *)
                                 CONCAT44(in_stack_fffffffffffffe64,
                                          CONCAT22(in_stack_fffffffffffffe62,
                                                   in_stack_fffffffffffffe60))), ' ' < local_d1 ||
          (bVar7 = true, local_d1 < '\x01')))) {
        bVar7 = local_d1 == '\x7f';
      }
      if (!bVar7) break;
      std::istreambuf_iterator<char,_std::char_traits<char>_>::operator++
                ((istreambuf_iterator<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe64,
                          CONCAT22(in_stack_fffffffffffffe62,in_stack_fffffffffffffe60)));
    }
    while( true ) {
      uVar6 = std::__cxx11::string::size();
      bVar7 = false;
      if (uVar6 < 0x1000) {
        bVar2 = std::operator!=((istreambuf_iterator<char,_std::char_traits<char>_> *)
                                CONCAT44(in_stack_fffffffffffffe64,
                                         CONCAT22(in_stack_fffffffffffffe62,
                                                  in_stack_fffffffffffffe60)),
                                (istreambuf_iterator<char,_std::char_traits<char>_> *)
                                CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        bVar7 = false;
        if (bVar2) {
          cVar3 = std::istreambuf_iterator<char,_std::char_traits<char>_>::operator*
                            ((istreambuf_iterator<char,_std::char_traits<char>_> *)
                             CONCAT44(in_stack_fffffffffffffe64,
                                      CONCAT22(in_stack_fffffffffffffe62,in_stack_fffffffffffffe60))
                            );
          bVar7 = cVar3 != '\n';
        }
      }
      if (!bVar7) break;
      iVar8 = std::istreambuf_iterator<char,_std::char_traits<char>_>::operator++
                        ((istreambuf_iterator<char,_std::char_traits<char>_> *)
                         CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
                         in_stack_fffffffffffffe64);
      local_f8 = iVar8._M_sbuf;
      local_f0 = iVar8._M_c;
      local_e8 = local_f8;
      local_e0 = local_f0;
      cVar3 = std::istreambuf_iterator<char,_std::char_traits<char>_>::operator*
                        ((istreambuf_iterator<char,_std::char_traits<char>_> *)
                         CONCAT44(in_stack_fffffffffffffe64,
                                  CONCAT22(in_stack_fffffffffffffe62,in_stack_fffffffffffffe60)));
      std::__cxx11::string::operator+=(local_d0,cVar3);
    }
    pfVar5 = std::
             unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
             ::operator->((unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
                           *)0x27cadb);
    iVar4 = (*(pfVar5->super_base_formatter)._vptr_base_formatter[5])(pfVar5,local_d0,&local_100);
    if ((CONCAT44(extraout_var,iVar4) == 0) ||
       (bVar7 = valid<long_double,double>(in_RDI,local_100), !bVar7)) {
      std::operator|=((_Ios_Iostate *)
                      CONCAT44(in_stack_fffffffffffffe64,
                               CONCAT22(in_stack_fffffffffffffe62,in_stack_fffffffffffffe60)),
                      in_stack_fffffffffffffe5c);
    }
    else {
      *in_stack_00000010 = (longdouble)local_100;
    }
    for (local_110 = std::__cxx11::string::size(); CONCAT44(extraout_var,iVar4) < local_110;
        local_110 = local_110 - 1) {
      in_stack_fffffffffffffe70 = local_50;
      std::__cxx11::string::operator[]((ulong)local_d0);
      std::istream::putback((char)in_stack_fffffffffffffe70);
    }
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              (in_stack_fffffffffffffe70,
               (istream_type *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
    uStack_18 = local_118;
    local_20 = local_120;
    bVar7 = std::operator==((istreambuf_iterator<char,_std::char_traits<char>_> *)
                            CONCAT44(in_stack_fffffffffffffe64,
                                     CONCAT22(in_stack_fffffffffffffe62,in_stack_fffffffffffffe60)),
                            (istreambuf_iterator<char,_std::char_traits<char>_> *)
                            CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    if (bVar7) {
      std::operator|=((_Ios_Iostate *)
                      CONCAT44(in_stack_fffffffffffffe64,
                               CONCAT22(in_stack_fffffffffffffe62,in_stack_fffffffffffffe60)),
                      in_stack_fffffffffffffe5c);
    }
    local_10._0_8_ = local_20;
    local_10._8_4_ = uStack_18;
    local_ac = 1;
    std::__cxx11::string::~string(local_d0);
  }
  std::
  unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
  ::~unique_ptr((unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
                 *)CONCAT44(in_stack_fffffffffffffe64,
                            CONCAT22(in_stack_fffffffffffffe62,in_stack_fffffffffffffe60)));
  iVar9._12_4_ = 0;
  iVar9._M_sbuf = (streambuf_type *)local_10._0_8_;
  iVar9._M_c = local_10._8_4_;
  return iVar9;
}

Assistant:

iter_type do_real_get(iter_type in,iter_type end,std::ios_base &ios,std::ios_base::iostate &err,ValueType &val) const
    {
        formatter_ptr formatter;
        stream_type *stream_ptr = dynamic_cast<stream_type *>(&ios);

        if(!stream_ptr || use_parent<ValueType>(ios,0) || (formatter = formatter_type::create(ios,loc_,enc_)).get()==0) {
            return std::num_get<CharType>::do_get(in,end,ios,err,val);
        }

        typedef typename details::cast_traits<ValueType>::cast_type cast_type;
        string_type tmp;
        tmp.reserve(64);

        CharType c;
        while(in!=end && (((c=*in)<=32 && (c>0)) || c==127)) // Assuming that ASCII is a subset
            ++in;

        while(tmp.size() < 4096 && in!=end && *in!='\n') {
            tmp += *in++;
        }

        cast_type value;
        size_t parsed_chars;

        if((parsed_chars = formatter->parse(tmp,value))==0 || !valid<ValueType>(value)) {
            err |= std::ios_base::failbit;
        }
        else {
            val=static_cast<ValueType>(value);
        }

        for(size_t n=tmp.size();n>parsed_chars;n--) {
            stream_ptr->putback(tmp[n-1]);
        }

        in = iter_type(*stream_ptr);

        if(in==end)
            err |=std::ios_base::eofbit;
        return in;
    }